

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O2

BitVector * bitVectorAlloc(int size)

{
  BitVector *pBVar1;
  
  pBVar1 = (BitVector *)calloc(1,(long)(size + -1 >> 6) * 8 + 8);
  return pBVar1;
}

Assistant:

static BitVector *
bitVectorAlloc(
  int size)
{
    int allocSize;
    BitVector *vector;

    /* Find out how many long's we need.
    ** There are sizeof(long) * 8 bits in a long.
    ** The ceiling of the ratio of two integers m and n is given
    ** by ((n-1)/m)+1.  Putting all this together, we get... */
    allocSize = ((size - 1) / (sizeof(BitVector) * 8)) + 1;
    vector = ABC_ALLOC(BitVector, allocSize);
    if (vector == NULL) return(NULL);
    /* Clear the whole array. */
    (void) memset(vector, 0, allocSize * sizeof(BitVector));
    return(vector);

}